

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O2

optional<unsigned_long> __thiscall
tsbp::LeftmostActiveOnly::Branch(LeftmostActiveOnly *this,size_t nodeId)

{
  pointer *__args;
  int iVar1;
  pointer psVar2;
  pointer pRVar3;
  pointer pRVar4;
  __uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> _Var5;
  pointer psVar6;
  int *piVar7;
  bool bVar8;
  size_type sVar9;
  vertex_descriptor vVar10;
  ulong uVar11;
  vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  _Storage<unsigned_long,_true> unaff_R14;
  pointer psVar12;
  reference rVar13;
  optional<unsigned_long> oVar14;
  AdjList *g;
  vertex_descriptor leftNodeId_1;
  size_t nodeId_local;
  Node *local_80;
  boost *local_78;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> attemptedItemIds;
  vertex_descriptor leftNodeId;
  Status SStack_48;
  
  psVar2 = (this->tree).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(Status *)((long)&psVar2[nodeId].super_StoredVertex.m_property.super_BaseNode + 8) !=
      InfeasibleSequence) {
    psVar2 = psVar2 + nodeId;
    this_00 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
              ((long)(psVar2->super_StoredVertex).m_property.Packing._M_t.
                     super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>.
                     _M_t + 0x18);
    unaff_R14._M_value =
         (long)*(pointer *)
                ((long)&(psVar2->super_StoredVertex).m_out_edges.
                        super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                + 8) -
         *(long *)&(psVar2->super_StoredVertex).m_out_edges.
                   super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
         >> 4;
    pRVar3 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pRVar4 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    nodeId_local = nodeId;
    local_78 = (boost *)nodeId;
    sVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(this_00);
    if ((int *)unaff_R14._M_value != (int *)(((long)pRVar3 - (long)pRVar4 >> 5) - sVar9)) {
      local_80 = &(psVar2->super_StoredVertex).m_property;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&attemptedItemIds,
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_start >> 5,0,
                 (allocator<unsigned_long> *)&leftNodeId);
      psVar2 = (this->tree).super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar6 = *(pointer *)
                ((long)&psVar2[nodeId].super_StoredVertex.m_out_edges.
                        super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                + 8);
      for (psVar12 = *(pointer *)
                      &psVar2[nodeId].super_StoredVertex.m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
          ; psVar12 != psVar6; psVar12 = psVar12 + 1) {
        sVar9 = (size_type)
                (this->tree).super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start
                [(psVar12->super_stored_edge<unsigned_long>).m_target].super_StoredVertex.m_property
                .super_BaseNode.ItemIdToPlace;
        if (-1 < (long)sVar9) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                    (&attemptedItemIds,sVar9,true);
        }
      }
      piVar7 = (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (unaff_R14 = (_Storage<unsigned_long,_true>)
                       (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; (int *)unaff_R14._M_value != piVar7;
          unaff_R14._M_value = unaff_R14._M_value + 4) {
        iVar1 = *(int *)unaff_R14;
        bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                          (this_00,(long)iVar1);
        if (!bVar8) {
          rVar13 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&attemptedItemIds,(long)iVar1);
          if ((*rVar13.m_block & rVar13.m_mask) == 0) {
            vVar10 = ((long)(this->tree).super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->tree).super_type.m_vertices.
                           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x30;
            leftNodeId._4_4_ = 0;
            SStack_48 = NotEvaluated;
            leftNodeId_1 = vVar10;
            leftNodeId._0_4_ = iVar1;
            std::make_unique<tsbp::Packing2D,tsbp::Packing2D&>
                      ((Packing2D *)&stack0xffffffffffffffc0);
            AddLeafNode(this,(Node *)&leftNodeId);
            std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::~unique_ptr
                      ((unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *)
                       &stack0xffffffffffffffc0);
            boost::
            add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                      ((pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool>
                        *)&leftNodeId,local_78,vVar10,(vertex_descriptor)&this->tree,in_R8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (&this->activeNodes,&leftNodeId_1);
            uVar11 = CONCAT71((int7)((ulong)&this->activeNodes >> 8),1);
            unaff_R14 = (_Storage<unsigned_long,_true>)leftNodeId_1;
            goto LAB_0013657b;
          }
        }
      }
      uVar11 = 0;
LAB_0013657b:
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (&attemptedItemIds);
      goto LAB_00136614;
    }
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<unsigned_long&>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->nodesToDeactivate,&nodeId_local);
    if (*(Status *)((long)&(psVar2->super_StoredVertex).m_property.super_BaseNode + 8) != Root) {
      _Var5._M_t.super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
      super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl =
           (psVar2->super_StoredVertex).m_property.Packing._M_t.
           super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t;
      if ((*(int *)((long)_Var5._M_t.
                          super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                          .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl + 4) != 0)
         || (*(int *)_Var5._M_t.
                     super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                     .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl !=
             *(int *)((long)_Var5._M_t.
                            super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                            .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl + 0x10)))
      {
        vVar10 = ((long)(this->tree).super_type.m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->tree).super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x30;
        __args = &attemptedItemIds.m_bits.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        attemptedItemIds.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x1ffffffff;
        attemptedItemIds.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = 2;
        leftNodeId = vVar10;
        std::make_unique<tsbp::Packing2D,tsbp::Packing2D&>((Packing2D *)__args);
        AddLeafNode(this,(Node *)&attemptedItemIds);
        std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::~unique_ptr
                  ((unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *)__args);
        boost::
        add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                  ((pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool> *)
                   &attemptedItemIds,(boost *)nodeId_local,vVar10,(vertex_descriptor)&this->tree,
                   in_R8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->activeNodes,&leftNodeId);
        uVar11 = CONCAT71((int7)((ulong)&this->activeNodes >> 8),1);
        unaff_R14 = (_Storage<unsigned_long,_true>)leftNodeId;
        goto LAB_00136614;
      }
      *(Status *)((long)&(psVar2->super_StoredVertex).m_property.super_BaseNode + 8) =
           InfeasibleSequence;
    }
  }
  uVar11 = 0;
LAB_00136614:
  oVar14.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar11 & 0xffffffff;
  oVar14.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R14._M_value;
  return (optional<unsigned_long>)
         oVar14.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> LeftmostActiveOnly::Branch(size_t nodeId)
{
    Node& currentNode = this->tree[nodeId];
    const boost::dynamic_bitset<>& placedItems = currentNode.PlacedItems();

    if (currentNode.NodeStatus == BaseNode::Status::InfeasibleSequence)
    {
        return std::nullopt;
    }

    // Determine number of outgoing edges.
    size_t numberOfOutgoingEdges = boost::out_degree(nodeId, this->tree);
    size_t numberOfRemainingItems = items.size() - placedItems.count();

    ////bool isFixedSequenceDeactivation = numberOfOutgoingEdges == 1 && IsFixedSequence(currentNode, -1);
    ////if (numberOfOutgoingEdges == numberOfRemainingItems || isFixedSequenceDeactivation)
    if (numberOfOutgoingEdges == numberOfRemainingItems)
    {
        // TODO.Logic: currently the DeactivatePlacement node is the last node that is generated. Rework to allow it to be explored in any sequence.

        this->nodesToDeactivate.emplace(nodeId);

        const Packing2D& packing = *currentNode.Packing;

        int placementX = packing.ActiveX;
        int placementY = packing.ActiveY;

        if (currentNode.NodeStatus == Node::Status::Root)
        {
            return std::nullopt;
        }

        if (placementY == 0 && placementX == packing.MaxX)
        {
            currentNode.NodeStatus = BaseNode::Status::InfeasibleSequence;
            return std::nullopt;
        }

        /*
        typename SearchTree::in_edge_iterator inEdgeIterator;
        typename SearchTree::in_edge_iterator inEdgeEndIterator;
        typename SearchTree::edge_descriptor inEdge;

        for (boost::tie(inEdgeIterator, inEdgeEndIterator) = boost::in_edges(this->tree, nodeId); inEdgeIterator != inEdgeEndIterator; ++inEdgeIterator)
        {
            inEdge = *inEdgeIterator;
            typename SearchTree::vertex_descriptor targetId = boost::source(inEdge, this->tree);
            const Node& targetNode = this->tree[targetId];
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{-1, BaseNode::Type::DeactivatePlacement, BaseNode::Status::NotEvaluated, std::make_unique<Packing2D>(*currentNode.Packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // TODO.Safety: Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().
        // TODO.Performance: Consider using std::unique_ptr<Node> to reduce copy effort.

        this->activeNodes.push_back(leftNodeId);

        return leftNodeId;
    }

    typename SearchTree::out_edge_iterator outEdgeIterator;
    typename SearchTree::out_edge_iterator outEdgeEndIterator;
    typename SearchTree::edge_descriptor outEdge;

    boost::dynamic_bitset<> attemptedItemIds(items.size());

    for (boost::tie(outEdgeIterator, outEdgeEndIterator) = boost::out_edges(nodeId, this->tree); outEdgeIterator != outEdgeEndIterator; ++outEdgeIterator)
    {
        outEdge = *outEdgeIterator;
        typename SearchTree::vertex_descriptor targetId = boost::target(outEdge, this->tree);
        const Node& targetNode = this->tree[targetId];

        if (targetNode.ItemIdToPlace >= 0)
        {
            attemptedItemIds.set(targetNode.ItemIdToPlace);
        }
    }

    std::optional<size_t> newNodeId;
    // TODO.Logic: different branching logic, e.g. largest item or deliberately disable placement.
    ////for (size_t i = 0; i < items.size(); i++)
    for (int i: this->branchingOrder)
    {
        ////if (placedItems.contains(i) || attemptedItemIds[i])
        if (placedItems[i] || attemptedItemIds[i])
        {
            continue;
        }

        /*
        if (!IsFixedSequence(currentNode, i))
        {
            continue;
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{(int)i, BaseNode::Type::UsePlacement, BaseNode::Status::NotEvaluated, std::make_unique<Packing2D>(*currentNode.Packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // TODO.Safety: Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().

        this->activeNodes.push_back(leftNodeId);
        newNodeId = leftNodeId;

        break;
    }

    return newNodeId;
}